

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O1

void __thiscall soul::IdentifierPath::IdentifierPath(IdentifierPath *this,Identifier i)

{
  (this->pathSections).items = (Identifier *)(this->pathSections).space;
  (this->pathSections).numActive = 0;
  (this->pathSections).numAllocated = 8;
  addSuffix(this,i);
  return;
}

Assistant:

explicit IdentifierPath (Identifier i) { addSuffix (i); }